

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<std::pair<unsigned_long,unsigned_long>>::
emplace_back<std::pair<unsigned_long,unsigned_long>>
          (SmallVectorBase<std::pair<unsigned_long,unsigned_long>> *this,
          pair<unsigned_long,_unsigned_long> *args)

{
  ulong uVar1;
  unsigned_long uVar2;
  unsigned_long *puVar3;
  unsigned_long *puVar4;
  unsigned_long *puVar5;
  unsigned_long *puVar6;
  EVP_PKEY_CTX *pEVar7;
  unsigned_long *puVar8;
  EVP_PKEY_CTX *ctx;
  long lVar9;
  
  puVar8 = (unsigned_long *)(*(long *)(this + 8) * 0x10 + *(long *)this);
  if (*(long *)(this + 8) != *(long *)(this + 0x10)) {
    uVar2 = args->second;
    *puVar8 = args->first;
    puVar8[1] = uVar2;
    lVar9 = *(long *)(this + 8);
    *(long *)(this + 8) = lVar9 + 1;
    return (reference)(*(long *)this + (lVar9 + 1) * 0x10 + -0x10);
  }
  if (*(long *)(this + 8) == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar7 = (EVP_PKEY_CTX *)(*(long *)(this + 8) + 1);
  uVar1 = *(ulong *)(this + 0x10);
  ctx = (EVP_PKEY_CTX *)(uVar1 * 2);
  if (pEVar7 < ctx) {
    pEVar7 = ctx;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    pEVar7 = (EVP_PKEY_CTX *)0x7ffffffffffffff;
  }
  lVar9 = (long)puVar8 - *(long *)this;
  puVar3 = (unsigned_long *)operator_new((long)pEVar7 << 4);
  uVar2 = args->second;
  *(unsigned_long *)((long)puVar3 + lVar9) = args->first;
  ((unsigned_long *)((long)puVar3 + lVar9))[1] = uVar2;
  puVar6 = *(unsigned_long **)this;
  puVar4 = puVar6 + *(long *)(this + 8) * 2;
  puVar5 = puVar3;
  if (puVar4 == puVar8) {
    for (; puVar6 != puVar8; puVar6 = puVar6 + 2) {
      uVar2 = puVar6[1];
      *puVar5 = *puVar6;
      puVar5[1] = uVar2;
      puVar5 = puVar5 + 2;
    }
  }
  else {
    for (; puVar6 != puVar8; puVar6 = puVar6 + 2) {
      uVar2 = puVar6[1];
      *puVar5 = *puVar6;
      puVar5[1] = uVar2;
      puVar5 = puVar5 + 2;
    }
    puVar6 = (unsigned_long *)(lVar9 + (long)puVar3);
    for (; puVar8 != puVar4; puVar8 = puVar8 + 2) {
      uVar2 = puVar8[1];
      puVar6[2] = *puVar8;
      puVar6[3] = uVar2;
      puVar6 = puVar6 + 2;
    }
  }
  SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>::cleanup
            ((SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_> *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(EVP_PKEY_CTX **)(this + 0x10) = pEVar7;
  *(unsigned_long **)this = puVar3;
  return (reference)((long)puVar3 + lVar9);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }